

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O1

void __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
::Consume::clean_dead_elements(Consume *this)

{
  undefined8 uVar1;
  uint uVar2;
  
  uVar2 = *(uint *)(this + 0x10);
  while ((uVar2 & 3) == 2) {
    advance_head(this);
    *(undefined8 **)(this + 8) = (undefined8 *)(*(ulong *)(this + 0x10) & 0xfffffffffffffff0);
    uVar1 = *(undefined8 *)(*(ulong *)(this + 0x10) & 0xfffffffffffffff0);
    *(undefined8 *)(this + 0x10) = uVar1;
    uVar2 = (uint)uVar1;
  }
  return;
}

Assistant:

void clean_dead_elements() noexcept
                {
                    while ((m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Dead)
                    {
                        advance_head();
                        move_next();
                    }
                }